

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

bool __thiscall tetgenio::load_tet(tetgenio *this,char *filebasename)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  size_t sVar4;
  FILE *__stream;
  long lVar5;
  ulong uVar6;
  int *piVar7;
  double *pdVar8;
  long lVar9;
  undefined4 *puVar10;
  int *in_RCX;
  bool bVar11;
  int iVar12;
  char *this_00;
  tetgenio *this_01;
  long lVar13;
  double dVar14;
  char *stringptr;
  char infilename [1024];
  char inputline [2048];
  tetgenio *local_c50;
  int local_c44;
  FILE *local_c40;
  char local_c38 [4];
  undefined1 auStack_c34 [1020];
  char local_838 [2056];
  
  strcpy(local_c38,filebasename);
  sVar4 = strlen(local_c38);
  builtin_strncpy(local_c38 + sVar4,".ele",4);
  auStack_c34[sVar4] = 0;
  __stream = fopen(local_c38,"r");
  if (__stream == (FILE *)0x0) {
    bVar11 = false;
  }
  else {
    this_00 = "Opening %s.\n";
    printf("Opening %s.\n",local_c38);
    local_c50 = (tetgenio *)
                readnumberline((tetgenio *)this_00,local_838,(FILE *)__stream,(char *)in_RCX);
    lVar5 = strtol((char *)local_c50,(char **)&local_c50,0);
    this->numberoftetrahedra = (int)lVar5;
    if ((int)lVar5 < 1) {
      puts("Error:  Invalid number of tetrahedra.");
      bVar11 = false;
    }
    else {
      while ((uVar6 = (ulong)(byte)local_c50->firstnumber, 0x2c < uVar6 ||
             ((0x100900000201U >> (uVar6 & 0x3f) & 1) == 0))) {
        local_c50 = (tetgenio *)((long)&local_c50->firstnumber + 1);
      }
LAB_0010ea5c:
      bVar1 = (byte)local_c50->firstnumber;
      uVar6 = (ulong)bVar1;
      if (0x2e < uVar6) {
LAB_0010ea71:
        if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010ea99;
        local_c50 = (tetgenio *)((long)&local_c50->firstnumber + 1);
        goto LAB_0010ea5c;
      }
      if ((0x680000000001U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_0010ea99;
      if (uVar6 != 0x23) goto LAB_0010ea71;
      *(char *)&local_c50->firstnumber = '\0';
LAB_0010ea99:
      if ((char)local_c50->firstnumber == '\0') {
        iVar12 = 4;
      }
      else {
        lVar5 = strtol((char *)local_c50,(char **)&local_c50,0);
        iVar12 = (int)lVar5;
      }
      this->numberofcorners = iVar12;
      while ((uVar6 = (ulong)(byte)local_c50->firstnumber, 0x2c < uVar6 ||
             ((0x100900000201U >> (uVar6 & 0x3f) & 1) == 0))) {
        local_c50 = (tetgenio *)((long)&local_c50->firstnumber + 1);
      }
LAB_0010eae9:
      bVar1 = (byte)local_c50->firstnumber;
      uVar6 = (ulong)bVar1;
      if (0x2e < uVar6) {
LAB_0010eae0:
        if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010eaf8;
        local_c50 = (tetgenio *)((long)&local_c50->firstnumber + 1);
        goto LAB_0010eae9;
      }
      if ((0x680000000001U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_0010eaf8;
      if (uVar6 != 0x23) goto LAB_0010eae0;
      *(char *)&local_c50->firstnumber = '\0';
LAB_0010eaf8:
      if ((char)local_c50->firstnumber == '\0') {
        iVar12 = 0;
      }
      else {
        lVar5 = strtol((char *)local_c50,(char **)&local_c50,0);
        iVar12 = (int)lVar5;
      }
      this->numberoftetrahedronattributes = iVar12;
      iVar12 = this->numberofcorners;
      if ((iVar12 == 4) || (iVar12 == 10)) {
        iVar2 = this->numberoftetrahedra;
        iVar12 = iVar12 * iVar2;
        this_01 = (tetgenio *)((long)iVar12 * 4);
        if (iVar12 < 0) {
          this_01 = (tetgenio *)0xffffffffffffffff;
        }
        piVar7 = (int *)operator_new__((ulong)this_01);
        this->tetrahedronlist = piVar7;
        if (0 < this->numberoftetrahedronattributes) {
          iVar2 = this->numberoftetrahedronattributes * iVar2;
          this_01 = (tetgenio *)((long)iVar2 * 8);
          if (iVar2 < 0) {
            this_01 = (tetgenio *)0xffffffffffffffff;
          }
          pdVar8 = (double *)operator_new__((ulong)this_01);
          this->tetrahedronattributelist = pdVar8;
        }
        bVar11 = true;
        if (0 < this->numberoftetrahedra) {
          iVar12 = 0;
          lVar13 = 0;
          lVar5 = 0;
          local_c40 = __stream;
          do {
            local_c44 = iVar12;
            local_c50 = (tetgenio *)
                        readnumberline(this_01,local_838,(FILE *)local_c40,(char *)in_RCX);
            if (0 < this->numberofcorners) {
              lVar5 = (long)(int)lVar5;
              iVar12 = 0;
              do {
                while ((this_01 = local_c50, uVar6 = (ulong)(byte)this_01->firstnumber, 0x2c < uVar6
                       || ((0x100900000201U >> (uVar6 & 0x3f) & 1) == 0))) {
                  local_c50 = (tetgenio *)((long)&this_01->firstnumber + 1);
                }
LAB_0010ebe8:
                bVar1 = (byte)this_01->firstnumber;
                uVar6 = (ulong)bVar1;
                if (0x2e < uVar6) {
LAB_0010ebfd:
                  if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010ec08;
                  this_01 = (tetgenio *)((long)&this_01->firstnumber + 1);
                  goto LAB_0010ebe8;
                }
                if ((0x680000000001U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_0010ec08;
                if (uVar6 != 0x23) goto LAB_0010ebfd;
                *(undefined1 *)&this_01->firstnumber = 0;
LAB_0010ec08:
                local_c50 = this_01;
                if ((char)this_01->firstnumber == '\0') {
                  printf("Error:  Tetrahedron %d is missing vertex %d in %s.\n",
                         (ulong)(uint)(local_c44 + this->firstnumber),(ulong)(iVar12 + 1),local_c38)
                  ;
LAB_0010ed54:
                  puVar10 = (undefined4 *)__cxa_allocate_exception(4);
                  *puVar10 = 1;
                  __cxa_throw(puVar10,&int::typeinfo,0);
                }
                lVar9 = strtol((char *)this_01,(char **)&local_c50,0);
                iVar2 = this->firstnumber;
                iVar3 = (int)lVar9;
                if ((iVar3 < iVar2) || (this->numberofpoints + iVar2 <= iVar3)) {
                  printf("Error:  Tetrahedron %d has an invalid vertex index.\n",
                         (ulong)(uint)(iVar2 + local_c44));
                  goto LAB_0010ed54;
                }
                in_RCX = this->tetrahedronlist;
                in_RCX[lVar5] = iVar3;
                lVar5 = lVar5 + 1;
                iVar12 = iVar12 + 1;
              } while (iVar12 < this->numberofcorners);
            }
            if (0 < this->numberoftetrahedronattributes) {
              lVar13 = (long)(int)lVar13;
              iVar12 = 0;
              do {
                while ((this_01 = local_c50, uVar6 = (ulong)(byte)this_01->firstnumber, 0x2c < uVar6
                       || ((0x100900000201U >> (uVar6 & 0x3f) & 1) == 0))) {
                  local_c50 = (tetgenio *)((long)&this_01->firstnumber + 1);
                }
LAB_0010ec80:
                bVar1 = (byte)this_01->firstnumber;
                uVar6 = (ulong)bVar1;
                if (0x2e < uVar6) {
LAB_0010ec95:
                  if (0xf5 < (byte)(bVar1 - 0x3a)) goto LAB_0010eca0;
                  this_01 = (tetgenio *)((long)&this_01->firstnumber + 1);
                  goto LAB_0010ec80;
                }
                if ((0x680000000001U >> (uVar6 & 0x3f) & 1) != 0) goto LAB_0010eca0;
                if (uVar6 != 0x23) goto LAB_0010ec95;
                *(undefined1 *)&this_01->firstnumber = 0;
LAB_0010eca0:
                local_c50 = this_01;
                if ((char)this_01->firstnumber == '\0') {
                  dVar14 = 0.0;
                }
                else {
                  dVar14 = strtod((char *)this_01,(char **)&local_c50);
                }
                this->tetrahedronattributelist[lVar13] = dVar14;
                lVar13 = lVar13 + 1;
                iVar12 = iVar12 + 1;
              } while (iVar12 < this->numberoftetrahedronattributes);
            }
            iVar12 = local_c44 + 1;
          } while (iVar12 < this->numberoftetrahedra);
          bVar11 = true;
          __stream = local_c40;
        }
      }
      else {
        bVar11 = false;
        printf("Error:  Wrong number of corners %d (should be 4 or 10).\n");
      }
    }
    fclose(__stream);
  }
  return bVar11;
}

Assistant:

bool tetgenio::load_tet(char* filebasename)
{
  FILE *infile;
  char infilename[FILENAMESIZE];
  char inputline[INPUTLINESIZE];
  char *stringptr;
  REAL attrib;
  int corner;
  int index, attribindex;
  int i, j;

  strcpy(infilename, filebasename);
  strcat(infilename, ".ele");

  infile = fopen(infilename, "r");
  if (infile != (FILE *) NULL) {
    printf("Opening %s.\n", infilename);
  } else {
    return false;
  }

  // Read number of elements, number of corners (4 or 10), number of
  //   element attributes.
  stringptr = readnumberline(inputline, infile, infilename);
  numberoftetrahedra = (int) strtol (stringptr, &stringptr, 0);
  if (numberoftetrahedra <= 0) {
    printf("Error:  Invalid number of tetrahedra.\n");
    fclose(infile);
    return false;
  }
  stringptr = findnextnumber(stringptr);
  if (*stringptr == '\0') {
    numberofcorners = 4;  // Default read 4 nodes per element.
  } else {
    numberofcorners = (int) strtol(stringptr, &stringptr, 0);
  }
  stringptr = findnextnumber(stringptr);
  if (*stringptr == '\0') {
    numberoftetrahedronattributes = 0; // Default no attribute.
  } else {
    numberoftetrahedronattributes = (int) strtol(stringptr, &stringptr, 0);
  }
  if (numberofcorners != 4 && numberofcorners != 10) {
    printf("Error:  Wrong number of corners %d (should be 4 or 10).\n", 
           numberofcorners);
    fclose(infile);
    return false;
  }

  // Allocate memory for tetrahedra.
  tetrahedronlist = new int[numberoftetrahedra * numberofcorners]; 
  if (tetrahedronlist == (int *) NULL) {
    terminatetetgen(NULL, 1);
  }
  // Allocate memory for output tetrahedron attributes if necessary.
  if (numberoftetrahedronattributes > 0) {
    tetrahedronattributelist = new REAL[numberoftetrahedra *
                                        numberoftetrahedronattributes];
    if (tetrahedronattributelist == (REAL *) NULL) {
      terminatetetgen(NULL, 1);
    }
  }

  // Read the list of tetrahedra.
  index = 0;
  attribindex = 0;
  for (i = 0; i < numberoftetrahedra; i++) {
    // Read tetrahedron index and the tetrahedron's corners.
    stringptr = readnumberline(inputline, infile, infilename);
    for (j = 0; j < numberofcorners; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        printf("Error:  Tetrahedron %d is missing vertex %d in %s.\n",
               i + firstnumber, j + 1, infilename);
        terminatetetgen(NULL, 1);
      }
      corner = (int) strtol(stringptr, &stringptr, 0);
      if (corner < firstnumber || corner >= numberofpoints + firstnumber) {
        printf("Error:  Tetrahedron %d has an invalid vertex index.\n",
               i + firstnumber);
        terminatetetgen(NULL, 1);
      }
      tetrahedronlist[index++] = corner;
    }
    // Read the tetrahedron's attributes.
    for (j = 0; j < numberoftetrahedronattributes; j++) {
      stringptr = findnextnumber(stringptr);
      if (*stringptr == '\0') {
        attrib = 0.0;
      } else {
        attrib = (REAL) strtod(stringptr, &stringptr);
      }
      tetrahedronattributelist[attribindex++] = attrib;
    }
  }

  fclose(infile);

  return true;
}